

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

void uv__mkostemp_initonce(void)

{
  uv__mkostemp = (_func_int_char_ptr_int *)dlsym(0,"mkostemp");
  dlerror();
  return;
}

Assistant:

static void uv__mkostemp_initonce(void) {
  /* z/os doesn't have RTLD_DEFAULT but that's okay
   * because it doesn't have mkostemp(O_CLOEXEC) either.
   */
#ifdef RTLD_DEFAULT
  uv__mkostemp = (int (*)(char*, int)) dlsym(RTLD_DEFAULT, "mkostemp");

  /* We don't care about errors, but we do want to clean them up.
   * If there has been no error, then dlerror() will just return
   * NULL.
   */
  dlerror();
#endif  /* RTLD_DEFAULT */
}